

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Config * __thiscall Catch::Session::config(Session *this)

{
  Config *pCVar1;
  
  pCVar1 = (this->m_config).m_p;
  if (pCVar1 == (Config *)0x0) {
    pCVar1 = (Config *)operator_new(0xe8);
    Config::Config(pCVar1,&this->m_configData);
    Ptr<Catch::Config>::operator=(&this->m_config,pCVar1);
    pCVar1 = (this->m_config).m_p;
  }
  return pCVar1;
}

Assistant:

bool operator !() const { return m_p == CATCH_NULL; }